

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_scientific.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::ScientificHandler::processQuantity
          (ScientificHandler *this,DecimalQuantity *quantity,MicroProps *micros,UErrorCode *status)

{
  UBool UVar1;
  bool bVar2;
  int32_t iVar3;
  undefined1 local_60 [40];
  ScientificModifier *local_38;
  ScientificModifier *mod;
  UErrorCode *pUStack_28;
  int32_t exponent;
  UErrorCode *status_local;
  MicroProps *micros_local;
  DecimalQuantity *quantity_local;
  ScientificHandler *this_local;
  
  pUStack_28 = status;
  status_local = (UErrorCode *)micros;
  micros_local = (MicroProps *)quantity;
  quantity_local = (DecimalQuantity *)this;
  (*this->fParent->_vptr_MicroPropsGenerator[2])(this->fParent,quantity,micros,status);
  UVar1 = ::U_FAILURE(*pUStack_28);
  if (UVar1 == '\0') {
    bVar2 = DecimalQuantity::isZero((DecimalQuantity *)micros_local);
    if (bVar2) {
      if (((this->fSettings->fRequireMinInt & 1U) == 0) ||
         (bVar2 = RoundingImpl::isSignificantDigits((RoundingImpl *)(status_local + 2)), !bVar2)) {
        RoundingImpl::apply((RoundingImpl *)(status_local + 2),(DecimalQuantity *)micros_local,
                            pUStack_28);
      }
      else {
        RoundingImpl::apply((RoundingImpl *)(status_local + 2),(DecimalQuantity *)micros_local,
                            (int)this->fSettings->fEngineeringInterval,*pUStack_28);
      }
      mod._4_4_ = 0;
    }
    else {
      iVar3 = RoundingImpl::chooseMultiplierAndApply
                        ((RoundingImpl *)(status_local + 2),(DecimalQuantity *)micros_local,
                         &this->super_MultiplierProducer,pUStack_28);
      mod._4_4_ = -iVar3;
    }
    local_38 = (ScientificModifier *)(status_local + 0x20);
    ScientificModifier::set(local_38,mod._4_4_,this);
    *(ScientificModifier **)(status_local + 0x1e) = local_38;
    RoundingImpl::passThrough();
    memcpy(status_local + 2,local_60,0x25);
  }
  return;
}

Assistant:

void ScientificHandler::processQuantity(DecimalQuantity &quantity, MicroProps &micros,
                                        UErrorCode &status) const {
    fParent->processQuantity(quantity, micros, status);
    if (U_FAILURE(status)) { return; }

    // Treat zero as if it had magnitude 0
    int32_t exponent;
    if (quantity.isZero()) {
        if (fSettings.fRequireMinInt && micros.rounder.isSignificantDigits()) {
            // Show "00.000E0" on pattern "00.000E0"
            micros.rounder.apply(quantity, fSettings.fEngineeringInterval, status);
            exponent = 0;
        } else {
            micros.rounder.apply(quantity, status);
            exponent = 0;
        }
    } else {
        exponent = -micros.rounder.chooseMultiplierAndApply(quantity, *this, status);
    }

    // Use MicroProps's helper ScientificModifier and save it as the modInner.
    ScientificModifier &mod = micros.helpers.scientificModifier;
    mod.set(exponent, this);
    micros.modInner = &mod;

    // We already performed rounding. Do not perform it again.
    micros.rounder = RoundingImpl::passThrough();
}